

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string err_4;
  undefined1 local_128 [8];
  string err_3;
  undefined1 local_e8 [8];
  string err_2;
  undefined1 local_a8 [8];
  string err_1;
  undefined1 local_68 [8];
  string err;
  SliceStaticLayerParams *params;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    Result::~Result(__return_storage_ptr__);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (bVar2) {
      Result::~Result(__return_storage_ptr__);
      err.field_2._8_8_ = Specification::NeuralNetworkLayer::slicestatic(layer);
      iVar3 = Specification::SliceStaticLayerParams::beginids_size
                        ((SliceStaticLayerParams *)err.field_2._8_8_);
      if (iVar3 == 0) {
        psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&err_1.field_2 + 8);
        std::operator+(pbVar1,"Begin IDs are required parameters for \'",psVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,pbVar1,"\' layer.");
        std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      else {
        iVar3 = Specification::SliceStaticLayerParams::endids_size
                          ((SliceStaticLayerParams *)err.field_2._8_8_);
        if (iVar3 == 0) {
          psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&err_2.field_2 + 8);
          std::operator+(pbVar1,"End IDs are required parameters for \'",psVar4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,pbVar1,"\' layer.");
          std::__cxx11::string::~string((string *)(err_2.field_2._M_local_buf + 8));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          std::__cxx11::string::~string((string *)local_a8);
        }
        else {
          iVar3 = Specification::SliceStaticLayerParams::strides_size
                            ((SliceStaticLayerParams *)err.field_2._8_8_);
          if (iVar3 == 0) {
            psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
            pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err_3.field_2 + 8);
            std::operator+(pbVar1,"Strides are required parameters for \'",psVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e8,pbVar1,"\' layer.");
            std::__cxx11::string::~string((string *)(err_3.field_2._M_local_buf + 8));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
            std::__cxx11::string::~string((string *)local_e8);
          }
          else {
            iVar3 = Specification::SliceStaticLayerParams::beginmasks_size
                              ((SliceStaticLayerParams *)err.field_2._8_8_);
            if (iVar3 == 0) {
              psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err_4.field_2 + 8);
              std::operator+(pbVar1,"Begin masks are required parameters for \'",psVar4);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128,pbVar1,"\' layer.");
              std::__cxx11::string::~string((string *)(err_4.field_2._M_local_buf + 8));
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_128);
              std::__cxx11::string::~string((string *)local_128);
            }
            else {
              iVar3 = Specification::SliceStaticLayerParams::endmasks_size
                                ((SliceStaticLayerParams *)err.field_2._8_8_);
              if (iVar3 == 0) {
                psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
                std::operator+(&local_188,"End masks are required parameters for \'",psVar4);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_168,&local_188,"\' layer.");
                std::__cxx11::string::~string((string *)&local_188);
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_168);
                std::__cxx11::string::~string((string *)local_168);
              }
              else {
                Result::Result(__return_storage_ptr__);
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.slicestatic();
    // check for required parameters
    if (params.beginids_size() == 0) {
        const std::string err = "Begin IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endids_size() == 0) {
        const std::string err = "End IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.strides_size() == 0) {
        const std::string err = "Strides are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.beginmasks_size() == 0) {
        const std::string err = "Begin masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endmasks_size() == 0) {
        const std::string err = "End masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}